

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  Mig_Fan_t MVar1;
  Mpm_Uni_t *pMVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void **ppvVar7;
  uint uVar8;
  Mpm_Cut_t *pMVar9;
  Mpm_Cut_t *pMVar10;
  long lVar11;
  bool bVar12;
  Mpm_Cut_t *pCut;
  Mpm_Cut_t *local_48;
  Mig_Obj_t *local_40;
  Mpm_Cut_t *local_38;
  
  local_48 = (Mpm_Cut_t *)0x0;
  uVar8 = (uint)pObj->pFans[3] >> 1;
  if ((p->vCutLists).nSize <= (int)uVar8) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  if ((p->nCutStore < 1) || (p->nNumCuts < p->nCutStore)) {
    __assert_fail("p->nCutStore > 0 && p->nCutStore <= p->nNumCuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x228,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  pMVar10 = (Mpm_Cut_t *)((p->vCutLists).pArray + uVar8);
  if (pMVar10->hNext != 0) {
    __assert_fail("*pList == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x229,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  if (p->nCutStore < 1) {
    bVar12 = false;
  }
  else {
    lVar11 = 0;
    pMVar9 = pMVar10;
    local_40 = pObj;
    do {
      pMVar2 = p->pCutStore[lVar11];
      iVar3 = Mpm_CutAlloc(p,*(uint *)&(pMVar2->pCut).field_0x4 >> 0x1b,&local_48);
      pMVar10 = local_48;
      uVar4 = *(uint *)&(pMVar2->pCut).field_0x4 & 0x1ffffff;
      uVar8 = *(uint *)&local_48->field_0x4;
      *(uint *)&local_48->field_0x4 = uVar8 & 0xfe000000 | uVar4;
      uVar5 = *(uint *)&(pMVar2->pCut).field_0x4 & 0x2000000;
      *(uint *)&local_48->field_0x4 = uVar8 & 0xfc000000 | uVar4 | uVar5;
      uVar6 = *(uint *)&(pMVar2->pCut).field_0x4 & 0x4000000;
      *(uint *)&local_48->field_0x4 = uVar8 & 0xf8000000 | uVar4 | uVar5 | uVar6;
      *(uint *)&local_48->field_0x4 =
           uVar4 | uVar5 | uVar6 | *(uint *)&(pMVar2->pCut).field_0x4 & 0xf8000000;
      memcpy(local_48->pLeaves,(pMVar2->pCut).pLeaves,
             (ulong)(*(uint *)&(pMVar2->pCut).field_0x4 >> 0x19 & 0xfffffffc));
      pMVar9->hNext = iVar3;
      uVar8 = (p->vFreeUnits).nCap;
      if ((p->vFreeUnits).nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          ppvVar7 = (p->vFreeUnits).pArray;
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,0x80);
          }
          (p->vFreeUnits).pArray = ppvVar7;
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar8 * 2;
          if (iVar3 <= (int)uVar8) goto LAB_004824cf;
          ppvVar7 = (p->vFreeUnits).pArray;
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar8 << 4);
          }
          (p->vFreeUnits).pArray = ppvVar7;
        }
        (p->vFreeUnits).nCap = iVar3;
      }
LAB_004824cf:
      iVar3 = (p->vFreeUnits).nSize;
      (p->vFreeUnits).nSize = iVar3 + 1;
      (p->vFreeUnits).pArray[iVar3] = pMVar2;
      lVar11 = lVar11 + 1;
      pMVar9 = pMVar10;
    } while (lVar11 < p->nCutStore);
    bVar12 = p->nCutStore == 1;
    pObj = local_40;
  }
  if ((p->vFreeUnits).nSize != p->nNumCuts + 1) {
    __assert_fail("Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x232,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  if ((!bVar12) || (iVar3 = 0, 0xfffffff < *(uint *)&local_48->field_0x4)) {
    MVar1 = pObj->pFans[3];
    iVar3 = Mpm_CutAlloc(p,1,&local_38);
    if (p->funcVar0 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    *(uint *)&local_38->field_0x4 =
         (*(uint *)&local_38->field_0x4 & 0xfe000000) + (p->funcVar0 & 0xffffffU) * 2;
    local_38->pLeaves[0] = (uint)MVar1 & 0xfffffffe;
  }
  pMVar10->hNext = iVar3;
  return;
}

Assistant:

void Mpm_ObjTranslateCutsFromStore( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut = NULL;
    Mpm_Uni_t * pUnit;
    int i, *pList = Mpm_ObjCutListP( p, pObj );
    assert( p->nCutStore > 0 && p->nCutStore <= p->nNumCuts );
    assert( *pList == 0 );
    // translate cuts
    for ( i = 0; i < p->nCutStore; i++ )
    {
        pUnit  = p->pCutStore[i];
        *pList = Mpm_CutCreate( p, &pUnit->pCut, &pCut );
        pList  = &pCut->hNext;
        Vec_PtrPush( &p->vFreeUnits, pUnit );
    }
    assert( Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1 );
    if ( p->nCutStore == 1 && pCut->nLeaves < 2 )
        *pList = 0;
    else
        *pList = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
}